

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockmanager_tests.cpp
# Opt level: O3

void __thiscall
blockmanager_tests::blockmanager_scan_unlink_already_pruned_files::test_method
          (blockmanager_scan_unlink_already_pruned_files *this)

{
  BlockManager *this_00;
  uint uVar1;
  ChainstateManager *pCVar2;
  pointer ppCVar3;
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *puVar4;
  Chainstate *pCVar5;
  CBlockFileInfo *pCVar6;
  CBlockIndex *pCVar7;
  uint uVar8;
  iterator pvVar9;
  iterator in_R9;
  iterator pvVar10;
  CBlockIndex *pCVar11;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  check_type cVar12;
  char *local_238;
  char *local_230;
  undefined1 *local_228;
  undefined1 *local_220;
  char *local_218;
  char *local_210;
  assertion_result local_208;
  char *local_1f0;
  undefined1 *local_1e0;
  undefined1 *local_1d8;
  char *local_1d0;
  char *local_1c8;
  CBlockIndex *new_tip;
  char *local_1b8;
  char *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  undefined1 *local_178;
  undefined1 *local_170;
  char *local_168;
  char *local_160;
  FlatFilePos pos;
  CBlockIndex *old_tip;
  CBlockIndex **local_148;
  CBlockIndex **local_140;
  FlatFilePos new_pos;
  assertion_result local_128;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock14;
  shared_count sStack_100;
  CBlockIndex ***local_f8;
  CBlock local_c8;
  undefined1 local_58 [24];
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  puVar4 = inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
                     (&(this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
                       super_BasicTestingSetup.m_node.chainman,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockmanager_tests.cpp"
                      ,0x3b,"test_method","m_node.chainman");
  pCVar2 = (puVar4->_M_t).
           super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>._M_t.
           super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
           super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl;
  criticalblock14.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
  criticalblock14.super_unique_lock._8_8_ =
       criticalblock14.super_unique_lock._8_8_ & 0xffffffffffffff00;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock14.super_unique_lock);
  pCVar5 = ChainstateManager::ActiveChainstate
                     ((puVar4->_M_t).
                      super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                      .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  ppCVar3 = (pCVar5->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppCVar3 ==
      (pCVar5->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    pCVar7 = (CBlockIndex *)0x0;
  }
  else {
    pCVar7 = ppCVar3[-1];
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock14.super_unique_lock);
  criticalblock14.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
  criticalblock14.super_unique_lock._8_8_ =
       criticalblock14.super_unique_lock._8_8_ & 0xffffffffffffff00;
  old_tip = pCVar7;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock14.super_unique_lock);
  this_00 = &pCVar2->m_blockman;
  pCVar6 = ::node::BlockManager::GetBlockFileInfo
                     (this_00,(long)(int)(-(uint)((pCVar7->nStatus & 8) == 0) | pCVar7->nFile));
  pCVar6->nSize = 0x8000000;
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock14.super_unique_lock);
  local_208._0_8_ = (pointer)0x0;
  local_208.m_message.px = (element_type *)0x0;
  local_208.m_message.pn.pi_ = (sp_counted_base *)0x0;
  CKey::GetPubKey((CPubKey *)&criticalblock14,&(this->super_TestChain100Setup).coinbaseKey);
  GetScriptForRawPubKey((CScript *)local_58,(CPubKey *)&criticalblock14);
  pvVar9 = (iterator)0x0;
  TestChain100Setup::CreateAndProcessBlock
            (&local_c8,&this->super_TestChain100Setup,
             (vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)&local_208,
             (CScript *)local_58,(Chainstate *)0x0);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&local_c8.vtx);
  if (0x1c < local_40._4_4_) {
    free((void *)local_58._0_8_);
  }
  std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>::~vector
            ((vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)&local_208);
  criticalblock14.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
  criticalblock14.super_unique_lock._8_8_ =
       criticalblock14.super_unique_lock._8_8_ & 0xffffffffffffff00;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock14.super_unique_lock);
  uVar8 = -(uint)((pCVar7->nStatus & 8) == 0) | pCVar7->nFile;
  ::node::BlockManager::PruneOneBlockFile(this_00,uVar8);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock14.super_unique_lock);
  pos.nPos = 0;
  criticalblock14.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
  criticalblock14.super_unique_lock._8_8_ =
       criticalblock14.super_unique_lock._8_8_ & 0xffffffffffffff00;
  pos.nFile = uVar8;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock14.super_unique_lock);
  ::node::BlockManager::ScanAndUnlinkAlreadyPrunedFiles(this_00);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock14.super_unique_lock);
  local_168 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockmanager_tests.cpp"
  ;
  local_160 = "";
  local_178 = &boost::unit_test::basic_cstring<char_const>::null;
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x4e;
  file.m_begin = (iterator)&local_168;
  msg.m_end = in_R9;
  msg.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_178,msg);
  _cVar12 = 0x2f7444;
  ::node::BlockManager::OpenBlockFile((AutoFile *)&criticalblock14,this_00,&pos,true);
  local_208.m_message.px = (element_type *)0x0;
  local_208.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_128._0_8_ = "!blockman.OpenBlockFile(pos, true).IsNull()";
  local_128.m_message.px = (element_type *)0xe46c8f;
  local_58[8] = '\0';
  local_58._0_8_ = &PTR__lazy_ostream_01389048;
  local_58._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_188 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockmanager_tests.cpp"
  ;
  local_180 = "";
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x0;
  local_40 = &local_128;
  local_208.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)(criticalblock14.super_unique_lock._M_device != (mutex_type *)0x0);
  boost::test_tools::tt_detail::report_assertion
            (&local_208,(lazy_ostream *)local_58,1,0,WARN,_cVar12,(size_t)&local_188,0x4e);
  boost::detail::shared_count::~shared_count(&local_208.m_message.pn);
  AutoFile::~AutoFile((AutoFile *)&criticalblock14);
  (pCVar2->m_blockman).m_have_pruned = true;
  criticalblock14.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
  criticalblock14.super_unique_lock._8_8_ =
       criticalblock14.super_unique_lock._8_8_ & 0xffffffffffffff00;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock14.super_unique_lock);
  ::node::BlockManager::ScanAndUnlinkAlreadyPrunedFiles(this_00);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock14.super_unique_lock);
  local_198 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockmanager_tests.cpp"
  ;
  local_190 = "";
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x54;
  file_00.m_begin = (iterator)&local_198;
  msg_00.m_end = pvVar10;
  msg_00.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_1a8,
             msg_00);
  _cVar12 = 0x2f7586;
  ::node::BlockManager::OpenBlockFile((AutoFile *)&criticalblock14,this_00,&pos,true);
  local_208.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)(criticalblock14.super_unique_lock._M_device == (mutex_type *)0x0);
  local_208.m_message.px = (element_type *)0x0;
  local_208.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_128._0_8_ = "blockman.OpenBlockFile(pos, true).IsNull()";
  local_128.m_message.px = (element_type *)0xe46c8f;
  local_58[8] = '\0';
  local_58._0_8_ = &PTR__lazy_ostream_01389048;
  local_58._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockmanager_tests.cpp"
  ;
  local_1b0 = "";
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x0;
  local_40 = &local_128;
  boost::test_tools::tt_detail::report_assertion
            (&local_208,(lazy_ostream *)local_58,1,0,WARN,_cVar12,(size_t)&local_1b8,0x54);
  boost::detail::shared_count::~shared_count(&local_208.m_message.pn);
  AutoFile::~AutoFile((AutoFile *)&criticalblock14);
  criticalblock14.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
  criticalblock14.super_unique_lock._8_8_ =
       criticalblock14.super_unique_lock._8_8_ & 0xffffffffffffff00;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock14.super_unique_lock);
  ::node::BlockManager::ScanAndUnlinkAlreadyPrunedFiles(this_00);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock14.super_unique_lock);
  criticalblock14.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
  criticalblock14.super_unique_lock._8_8_ =
       criticalblock14.super_unique_lock._8_8_ & 0xffffffffffffff00;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock14.super_unique_lock);
  pCVar5 = ChainstateManager::ActiveChainstate
                     ((puVar4->_M_t).
                      super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                      .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  ppCVar3 = (pCVar5->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppCVar3 ==
      (pCVar5->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    pCVar11 = (CBlockIndex *)0x0;
  }
  else {
    pCVar11 = ppCVar3[-1];
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock14.super_unique_lock);
  local_1d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockmanager_tests.cpp"
  ;
  local_1c8 = "";
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x5b;
  file_01.m_begin = (iterator)&local_1d0;
  msg_01.m_end = pvVar10;
  msg_01.m_begin = pvVar9;
  new_tip = pCVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_1e0,
             msg_01);
  local_208.m_message.px = (element_type *)((ulong)local_208.m_message.px & 0xffffffffffffff00);
  local_208._0_8_ = &PTR__lazy_ostream_01388f08;
  local_208.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1f0 = "";
  criticalblock14.super_unique_lock._M_device =
       (mutex_type *)CONCAT71(criticalblock14.super_unique_lock._M_device._1_7_,pCVar7 == pCVar11);
  local_128.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(pCVar7 != pCVar11);
  criticalblock14.super_unique_lock._M_owns = false;
  criticalblock14.super_unique_lock._9_7_ = 0;
  sStack_100.pi_ = (sp_counted_base *)0x0;
  local_128.m_message.px = (element_type *)0x0;
  local_128.m_message.pn.pi_ = (sp_counted_base *)0x0;
  boost::detail::shared_count::~shared_count(&sStack_100);
  new_pos = (FlatFilePos)anon_var_dwarf_549fb7;
  local_140 = &old_tip;
  local_f8 = &local_140;
  criticalblock14.super_unique_lock._8_8_ =
       criticalblock14.super_unique_lock._8_8_ & 0xffffffffffffff00;
  criticalblock14.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_01389dd0;
  sStack_100.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_40 = (assertion_result *)&local_148;
  local_148 = &new_tip;
  local_58[8] = '\0';
  local_58._0_8_ = &PTR__lazy_ostream_01389dd0;
  local_58._16_8_ = boost::unit_test::lazy_ostream::inst;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x3;
  boost::test_tools::tt_detail::report_assertion
            (&local_128,(lazy_ostream *)&local_208,1,3,REQUIRE,0xe46c90,(size_t)&new_pos,0x5b,
             &criticalblock14.super_unique_lock,"new_tip",local_58);
  boost::detail::shared_count::~shared_count(&local_128.m_message.pn);
  criticalblock14.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
  criticalblock14.super_unique_lock._8_8_ =
       criticalblock14.super_unique_lock._8_8_ & 0xffffffffffffff00;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock14.super_unique_lock);
  uVar8 = new_tip->nStatus;
  uVar1 = new_tip->nFile;
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock14.super_unique_lock);
  new_pos.nPos = 0;
  new_pos.nFile = -(uint)((uVar8 & 8) == 0) | uVar1;
  local_218 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockmanager_tests.cpp"
  ;
  local_210 = "";
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x5e;
  file_02.m_begin = (iterator)&local_218;
  msg_02.m_end = pvVar10;
  msg_02.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_228,
             msg_02);
  _cVar12 = 0x2f78c1;
  ::node::BlockManager::OpenBlockFile((AutoFile *)&criticalblock14,this_00,&new_pos,true);
  local_208.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)(criticalblock14.super_unique_lock._M_device != (mutex_type *)0x0);
  local_208.m_message.px = (element_type *)0x0;
  local_208.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_128._0_8_ = "!blockman.OpenBlockFile(new_pos, true).IsNull()";
  local_128.m_message.px = (element_type *)0xe46cc7;
  local_58[8] = '\0';
  local_58._0_8_ = &PTR__lazy_ostream_01389048;
  local_58._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_238 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockmanager_tests.cpp"
  ;
  local_230 = "";
  local_40 = &local_128;
  boost::test_tools::tt_detail::report_assertion
            (&local_208,(lazy_ostream *)local_58,1,0,WARN,_cVar12,(size_t)&local_238,0x5e);
  boost::detail::shared_count::~shared_count(&local_208.m_message.pn);
  AutoFile::~AutoFile((AutoFile *)&criticalblock14);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(blockmanager_scan_unlink_already_pruned_files, TestChain100Setup)
{
    // Cap last block file size, and mine new block in a new block file.
    const auto& chainman = Assert(m_node.chainman);
    auto& blockman = chainman->m_blockman;
    const CBlockIndex* old_tip{WITH_LOCK(chainman->GetMutex(), return chainman->ActiveChain().Tip())};
    WITH_LOCK(chainman->GetMutex(), blockman.GetBlockFileInfo(old_tip->GetBlockPos().nFile)->nSize = MAX_BLOCKFILE_SIZE);
    CreateAndProcessBlock({}, GetScriptForRawPubKey(coinbaseKey.GetPubKey()));

    // Prune the older block file, but don't unlink it
    int file_number;
    {
        LOCK(chainman->GetMutex());
        file_number = old_tip->GetBlockPos().nFile;
        blockman.PruneOneBlockFile(file_number);
    }

    const FlatFilePos pos(file_number, 0);

    // Check that the file is not unlinked after ScanAndUnlinkAlreadyPrunedFiles
    // if m_have_pruned is not yet set
    WITH_LOCK(chainman->GetMutex(), blockman.ScanAndUnlinkAlreadyPrunedFiles());
    BOOST_CHECK(!blockman.OpenBlockFile(pos, true).IsNull());

    // Check that the file is unlinked after ScanAndUnlinkAlreadyPrunedFiles
    // once m_have_pruned is set
    blockman.m_have_pruned = true;
    WITH_LOCK(chainman->GetMutex(), blockman.ScanAndUnlinkAlreadyPrunedFiles());
    BOOST_CHECK(blockman.OpenBlockFile(pos, true).IsNull());

    // Check that calling with already pruned files doesn't cause an error
    WITH_LOCK(chainman->GetMutex(), blockman.ScanAndUnlinkAlreadyPrunedFiles());

    // Check that the new tip file has not been removed
    const CBlockIndex* new_tip{WITH_LOCK(chainman->GetMutex(), return chainman->ActiveChain().Tip())};
    BOOST_CHECK_NE(old_tip, new_tip);
    const int new_file_number{WITH_LOCK(chainman->GetMutex(), return new_tip->GetBlockPos().nFile)};
    const FlatFilePos new_pos(new_file_number, 0);
    BOOST_CHECK(!blockman.OpenBlockFile(new_pos, true).IsNull());
}